

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testpixmap.cpp
# Opt level: O2

void print_RGB_image(uchar *storage,char *name,int width,int height,bool top_first)

{
  ostream *poVar1;
  long lVar2;
  int iVar3;
  undefined3 in_register_00000081;
  uint uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"RGB for ");
  poVar1 = std::operator<<(poVar1,name);
  iVar5 = 0;
  if (width < 1) {
    width = 0;
  }
  if (CONCAT31(in_register_00000081,top_first) == 0) {
    poVar1 = std::operator<<(poVar1," last row first");
    lVar2 = 0;
    while( true ) {
      std::endl<char,std::char_traits<char>>(poVar1);
      if (height < 1) break;
      height = height + -1;
      poVar1 = std::operator<<((ostream *)&std::cout,"Row ");
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,height);
      std::operator<<(poVar1,":");
      lVar2 = (long)(int)lVar2;
      iVar6 = 0;
      uVar4 = 0;
      iVar5 = width;
      while( true ) {
        bVar7 = iVar5 == 0;
        iVar5 = iVar5 + -1;
        if (bVar7) break;
        if ((uVar4 / 5) * 5 + iVar6 == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        poVar1 = std::operator<<((ostream *)&std::cout," (");
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(uint)storage[lVar2]);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(uint)storage[lVar2 + 1]);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(uint)storage[lVar2 + 2]);
        std::operator<<(poVar1,")");
        lVar2 = lVar2 + 3;
        uVar4 = uVar4 + 1;
        iVar6 = iVar6 + -1;
      }
      poVar1 = (ostream *)&std::cout;
    }
  }
  else {
    poVar1 = std::operator<<(poVar1," first row first");
    std::endl<char,std::char_traits<char>>(poVar1);
    if (height < 1) {
      height = iVar5;
    }
    lVar2 = 0;
    for (; iVar5 != height; iVar5 = iVar5 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Row ");
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,iVar5);
      std::operator<<(poVar1,":");
      lVar2 = (long)(int)lVar2;
      iVar3 = 0;
      uVar4 = 0;
      iVar6 = width;
      while( true ) {
        bVar7 = iVar6 == 0;
        iVar6 = iVar6 + -1;
        if (bVar7) break;
        if ((uVar4 / 5) * 5 + iVar3 == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        poVar1 = std::operator<<((ostream *)&std::cout," (");
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(uint)storage[lVar2]);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(uint)storage[lVar2 + 1]);
        poVar1 = std::operator<<(poVar1,",");
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(uint)storage[lVar2 + 2]);
        std::operator<<(poVar1,")");
        lVar2 = lVar2 + 3;
        uVar4 = uVar4 + 1;
        iVar3 = iVar3 + -1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  return;
}

Assistant:

void
print_RGB_image(unsigned const char *storage, const char *name, int width,
                int height, bool top_first)
{
  int row, col, index = 0;
  if (top_first) {
    cout << "RGB for " << name << " first row first" << endl;
    for (row = 0; row < height; row++) {
      cout << "Row " << row << ":";
      for (col = 0; col < width; col++) {
        if ((col / 5) * 5 == col)
          cout << endl;
        cout << " (" << (int)storage[index] << "," << (int)storage[index + 1]
             << "," << (int)storage[index + 2] << ")";
        index += 3;
      }
      cout << endl;
    }
  } else {
    cout << "RGB for " << name << " last row first" << endl;
    for (row = height - 1; row >= 0; row--) {
      cout << "Row " << row << ":";
      for (col = 0; col < width; col++) {
        if ((col / 5) * 5 == col)
          cout << endl;
        cout << " (" << (int)storage[index] << "," << (int)storage[index + 1]
             << "," << (int)storage[index + 2] << ")";
        index += 3;
      }
      cout << endl;
    }
  }
}